

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::AssertionHandler::handleExpr<acto::actor_ref_const&>
          (AssertionHandler *this,ExprLhs<const_acto::actor_ref_&> *expr)

{
  actor_ref *this_00;
  ITransientExpression local_28;
  actor_ref *local_18;
  
  this_00 = expr->m_lhs;
  local_28.m_result = acto::actor_ref::assigned(this_00);
  local_28.m_isBinaryExpression = false;
  local_28._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00195938;
  local_18 = this_00;
  handleExpr(this,&local_28);
  ITransientExpression::~ITransientExpression(&local_28);
  return;
}

Assistant:

void handleExpr( ExprLhs<T> const& expr ) {
            handleExpr( expr.makeUnaryExpr() );
        }